

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
          (buffer_appender<char> out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  significand_type sVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  buffer_appender<char> bVar6;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  char cVar12;
  undefined7 in_register_00000081;
  ulong uVar13;
  char local_c5;
  int num_zeros;
  sign_t sign;
  int significand_size;
  basic_format_specs<char> *local_b8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_b0;
  uint local_a4;
  ulong local_a0;
  significand_type significand;
  int local_90;
  int exp;
  float_specs fspecs_local;
  anon_class_40_7_ef14d3db write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  local_a4 = (uint)CONCAT71(in_register_00000081,decimal_point);
  sVar1 = fp->significand;
  local_c5 = decimal_point;
  local_b8 = specs;
  local_b0 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  significand = sVar1;
  fspecs_local = fspecs;
  iVar4 = get_significand_size<double>(fp);
  uVar2 = fspecs._4_4_;
  sign = uVar2 >> 8 & 0xff;
  local_a0 = (ulong)((uint)(sign != none) + iVar4);
  iVar10 = fp->exponent;
  local_90 = iVar10 + iVar4 + -1;
  significand_size = iVar4;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_90;
  bVar3 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
          ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  iVar11 = fspecs.precision;
  if (bVar3) {
    iVar10 = iVar10 + iVar4;
    if ((uVar2 >> 0x14 & 1) == 0) {
      uVar5 = 0;
      uVar13 = (ulong)(local_a4 & 0xff);
      if (iVar4 == 1) {
        uVar13 = uVar5;
      }
      cVar12 = (char)uVar13;
      uVar13 = local_a0;
    }
    else {
      uVar5 = 0;
      if (0 < iVar11 - iVar4) {
        uVar5 = (ulong)(uint)(iVar11 - iVar4);
      }
      uVar13 = local_a0 + uVar5;
      cVar12 = (char)local_a4;
    }
    iVar11 = 1 - iVar10;
    if (0 < iVar10) {
      iVar11 = local_90;
    }
    lVar8 = 2;
    if (99 < iVar11) {
      lVar8 = (ulong)(999 < iVar11) + 3;
    }
    sVar9 = (3 - (ulong)(cVar12 == '\0')) + uVar13 + lVar8;
    write._0_8_ = CONCAT44(write._4_4_,uVar2 >> 8) & 0xffffffff000000ff;
    write.decimal_point = cVar12;
    write.significand_size = iVar4;
    write._24_8_ = CONCAT35(write._29_3_,CONCAT14(((uVar2 >> 0x10 & 1) == 0) << 5,(int)uVar5)) |
                   0x4500000000;
    write.output_exp = local_90;
    write.significand = sVar1;
    if (0 < local_b8->width) {
      bVar6 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_&>
                        ((buffer_appender<char>)local_b0.container,local_b8,sVar9,&write);
      return (buffer_appender<char>)
             bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    bVar6 = reserve<char>((buffer_appender<char>)local_b0.container,sVar9);
    bVar6 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
            ::anon_class_40_7_ef14d3db::operator()
                      (&write,(iterator)
                              bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    return (buffer_appender<char>)
           bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
  }
  iVar10 = fp->exponent;
  exp = iVar4 + iVar10;
  if ((long)iVar10 < 0) {
    if (0 < exp) {
      num_zeros = iVar11 - iVar4 & (int)(uVar2 << 0xb) >> 0x1f;
      uVar2 = num_zeros;
      if (num_zeros < 1) {
        uVar2 = 0;
      }
      write._0_8_ = &sign;
      write.significand = (significand_type)&significand;
      write._16_8_ = &significand_size;
      write._24_8_ = &exp;
      write._32_8_ = &local_c5;
      bVar6 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_>
                        ((buffer_appender<char>)local_b0.container,local_b8,
                         (ulong)uVar2 + 1 + local_a0,(anon_class_48_6_48d028d1 *)&write);
      return (buffer_appender<char>)
             bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    iVar10 = -exp;
    num_zeros = iVar10;
    if (SBORROW4(iVar11,iVar10) != iVar11 + exp < 0) {
      num_zeros = iVar11;
    }
    if (iVar11 < 0) {
      num_zeros = iVar10;
    }
    if (iVar4 != 0) {
      num_zeros = iVar10;
    }
    write.significand = (significand_type)&num_zeros;
    write._0_8_ = &sign;
    write._16_8_ = &significand_size;
    write._24_8_ = &fspecs_local;
    write._32_8_ = &local_c5;
    bVar7.container =
         (buffer<char> *)
         write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_4_>
                   (local_b0.container,local_b8,(num_zeros + 2) + local_a0,
                    (anon_class_48_6_9afe1116 *)&write);
    return (buffer_appender<char>)
           (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar7.container;
  }
  sVar9 = (long)iVar10 + local_a0;
  num_zeros = iVar11 - exp;
  uVar5 = (ulong)(uint)num_zeros;
  if ((uVar2 >> 0x14 & 1) != 0) {
    if (fspecs._4_1_ == '\x02' || 0 < num_zeros) {
      if (num_zeros < 1) goto LAB_001889c4;
    }
    else {
      num_zeros = 1;
      uVar5 = 1;
    }
    sVar9 = sVar9 + uVar5;
  }
LAB_001889c4:
  write._0_8_ = &sign;
  write.significand = (significand_type)&significand;
  write._16_8_ = &significand_size;
  write._32_8_ = &fspecs_local;
  write._24_8_ = fp;
  bVar6 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_2_>
                    ((buffer_appender<char>)local_b0.container,local_b8,sVar9,
                     (anon_class_56_7_a2a26a24 *)&write);
  return (buffer_appender<char>)
         bVar6.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}